

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_0,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_0> *rhs,long depth,long cols,
            long stride,long offset)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  
  if (stride != 0 || offset != 0) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x772,
                  "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = false]"
                 );
  }
  uVar2 = cols + 3;
  if (-1 < cols) {
    uVar2 = cols;
  }
  uVar6 = uVar2 & 0xfffffffffffffffc;
  if (cols < 4) {
    lVar7 = 0;
  }
  else {
    pdVar8 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    lVar1 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    pdVar3 = pdVar8 + lVar1 * 3;
    pdVar11 = pdVar8 + lVar1;
    pdVar9 = pdVar8 + lVar1 * 2;
    lVar10 = 0;
    lVar7 = 0;
    do {
      if (0 < depth) {
        lVar5 = 0;
        lVar4 = depth;
        do {
          blockB[lVar7 + lVar5] = *(double *)((long)pdVar8 + lVar5 * 2);
          blockB[lVar7 + lVar5 + 1] = *(double *)((long)pdVar11 + lVar5 * 2);
          blockB[lVar7 + lVar5 + 2] = *(double *)((long)pdVar9 + lVar5 * 2);
          blockB[lVar7 + lVar5 + 3] = *(double *)((long)pdVar3 + lVar5 * 2);
          lVar5 = lVar5 + 4;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        lVar7 = lVar7 + lVar5;
      }
      lVar10 = lVar10 + 4;
      pdVar3 = pdVar3 + lVar1 * 4;
      pdVar9 = pdVar9 + lVar1 * 4;
      pdVar11 = pdVar11 + lVar1 * 4;
      pdVar8 = pdVar8 + lVar1 * 4;
    } while (lVar10 < (long)uVar6);
  }
  if ((long)uVar6 < cols) {
    lVar1 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride;
    pdVar3 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
             ((long)uVar2 >> 2) * lVar1 * 4;
    do {
      if (0 < depth) {
        lVar10 = 0;
        do {
          blockB[lVar7 + lVar10] = pdVar3[lVar10];
          lVar10 = lVar10 + 1;
        } while (depth != lVar10);
        lVar7 = lVar7 + lVar10;
      }
      uVar6 = uVar6 + 1;
      pdVar3 = pdVar3 + lVar1;
    } while (uVar6 != cols);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;
  const Index peeled_k = (depth/PacketSize)*PacketSize;
//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       const Scalar* b0 = &rhs[(j2+0)*rhsStride];
//       const Scalar* b1 = &rhs[(j2+1)*rhsStride];
//       const Scalar* b2 = &rhs[(j2+2)*rhsStride];
//       const Scalar* b3 = &rhs[(j2+3)*rhsStride];
//       const Scalar* b4 = &rhs[(j2+4)*rhsStride];
//       const Scalar* b5 = &rhs[(j2+5)*rhsStride];
//       const Scalar* b6 = &rhs[(j2+6)*rhsStride];
//       const Scalar* b7 = &rhs[(j2+7)*rhsStride];
//       Index k=0;
//       if(PacketSize==8) // TODO enbale vectorized transposition for PacketSize==4
//       {
//         for(; k<peeled_k; k+=PacketSize) {
//           PacketBlock<Packet> kernel;
//           for (int p = 0; p < PacketSize; ++p) {
//             kernel.packet[p] = ploadu<Packet>(&rhs[(j2+p)*rhsStride+k]);
//           }
//           ptranspose(kernel);
//           for (int p = 0; p < PacketSize; ++p) {
//             pstoreu(blockB+count, cj.pconj(kernel.packet[p]));
//             count+=PacketSize;
//           }
//         }
//       }
//       for(; k<depth; k++)
//       {
//         blockB[count+0] = cj(b0[k]);
//         blockB[count+1] = cj(b1[k]);
//         blockB[count+2] = cj(b2[k]);
//         blockB[count+3] = cj(b3[k]);
//         blockB[count+4] = cj(b4[k]);
//         blockB[count+5] = cj(b5[k]);
//         blockB[count+6] = cj(b6[k]);
//         blockB[count+7] = cj(b7[k]);
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }

  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      const LinearMapper dm0 = rhs.getLinearMapper(0, j2 + 0);
      const LinearMapper dm1 = rhs.getLinearMapper(0, j2 + 1);
      const LinearMapper dm2 = rhs.getLinearMapper(0, j2 + 2);
      const LinearMapper dm3 = rhs.getLinearMapper(0, j2 + 3);

      Index k=0;
      if((PacketSize%4)==0) // TODO enable vectorized transposition for PacketSize==2 ??
      {
        for(; k<peeled_k; k+=PacketSize) {
          PacketBlock<Packet,(PacketSize%4)==0?4:PacketSize> kernel;
          kernel.packet[0] = dm0.loadPacket(k);
          kernel.packet[1%PacketSize] = dm1.loadPacket(k);
          kernel.packet[2%PacketSize] = dm2.loadPacket(k);
          kernel.packet[3%PacketSize] = dm3.loadPacket(k);
          ptranspose(kernel);
          pstoreu(blockB+count+0*PacketSize, cj.pconj(kernel.packet[0]));
          pstoreu(blockB+count+1*PacketSize, cj.pconj(kernel.packet[1%PacketSize]));
          pstoreu(blockB+count+2*PacketSize, cj.pconj(kernel.packet[2%PacketSize]));
          pstoreu(blockB+count+3*PacketSize, cj.pconj(kernel.packet[3%PacketSize]));
          count+=4*PacketSize;
        }
      }
      for(; k<depth; k++)
      {
        blockB[count+0] = cj(dm0(k));
        blockB[count+1] = cj(dm1(k));
        blockB[count+2] = cj(dm2(k));
        blockB[count+3] = cj(dm3(k));
        count += 4;
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const LinearMapper dm0 = rhs.getLinearMapper(0, j2);
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(dm0(k));
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}